

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O0

bool __thiscall leveldb::BloomTest::Matches(BloomTest *this,Slice *s)

{
  FilterPolicy *pFVar1;
  Slice *pSVar2;
  bool bVar3;
  int iVar4;
  Slice local_28;
  Slice *local_18;
  Slice *s_local;
  BloomTest *this_local;
  
  local_18 = s;
  s_local = (Slice *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->keys_);
  if (!bVar3) {
    Build(this);
  }
  pSVar2 = local_18;
  pFVar1 = this->policy_;
  Slice::Slice(&local_28,&this->filter_);
  iVar4 = (*pFVar1->_vptr_FilterPolicy[4])(pFVar1,pSVar2,&local_28);
  return (bool)((byte)iVar4 & 1);
}

Assistant:

bool Matches(const Slice& s) {
    if (!keys_.empty()) {
      Build();
    }
    return policy_->KeyMayMatch(s, filter_);
  }